

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix<Rational> __thiscall Matrix<Rational>::transposed(Matrix<Rational> *this)

{
  row_t this_00;
  Rational *extraout_RDX;
  Rational *pRVar1;
  Rational *extraout_RDX_00;
  uint *in_RSI;
  undefined8 in_RDI;
  Matrix<Rational> MVar2;
  uint j;
  uint i;
  Matrix<Rational> *res;
  Rational *in_stack_ffffffffffffff88;
  MatrixRow<Rational_&> local_40 [3];
  MatrixRow<const_Rational_&> in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint c;
  uint local_18;
  
  Matrix((Matrix<Rational> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
         (uint)((ulong)in_stack_ffffffffffffffd8.arr >> 0x20),(uint)in_stack_ffffffffffffffd8.arr);
  pRVar1 = extraout_RDX;
  for (local_18 = 0; local_18 < *in_RSI; local_18 = local_18 + 1) {
    for (c = 0; c < in_RSI[1]; c = c + 1) {
      operator[]((Matrix<Rational> *)in_stack_ffffffffffffff88,0);
      MatrixRow<const_Rational_&>::operator[]
                ((MatrixRow<const_Rational_&> *)&stack0xffffffffffffffd8,c);
      this_00 = operator[](in_stack_ffffffffffffff88,0);
      local_40[0].arr = this_00.arr;
      in_stack_ffffffffffffff88 = MatrixRow<Rational_&>::operator[](local_40,local_18);
      Rational::operator=(this_00.arr,in_stack_ffffffffffffff88);
      pRVar1 = extraout_RDX_00;
    }
  }
  MVar2.arr = pRVar1;
  MVar2._0_8_ = in_RDI;
  return MVar2;
}

Assistant:

const Matrix<Field> Matrix<Field>::transposed() const
{
    Matrix res(N, M);
    for(unsigned i = 0; i < M; ++i)
        for(unsigned j = 0; j < N; ++j)
        {
            res[j][i] = (*this)[i][j];
        }
    return res;
}